

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsInter.c
# Opt level: O1

uint * Abc_NtkMfsInterplateTruth(Mfs_Man_t *p,int *pCands,int nCands,int fInvert)

{
  Vec_Int_t *pVVar1;
  Cnf_Dat_t *pCVar2;
  int iVar3;
  sat_solver *s;
  Sto_Man_t *pCnf;
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  uint *puTruth;
  uint *local_38;
  
  s = Abc_MfsCreateSolverResub(p,pCands,nCands,fInvert);
  iVar3 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,(long)p->pPars->nBTLimit,0,0,0);
  if (iVar3 == -1) {
    pCnf = (Sto_Man_t *)sat_solver_store_release(s);
    sat_solver_delete(s);
    piVar4 = Int_ManSetGlobalVars(p->pMan,nCands);
    if (0 < nCands) {
      pVVar1 = p->vProjVarsCnf;
      pCVar2 = p->pCnf;
      uVar5 = 0;
      do {
        uVar6 = (pCands[uVar5] >> 1) + pCVar2->nVars * -2;
        if (((int)uVar6 < 0) || (pVVar1->nSize <= (int)uVar6)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar4[uVar5] = pVVar1->pArray[uVar6];
        uVar5 = uVar5 + 1;
      } while ((uint)nCands != uVar5);
    }
    iVar3 = Int_ManInterpolate(p->pMan,pCnf,0,&local_38);
    Sto_ManFree(pCnf);
    if (iVar3 != nCands) {
      __assert_fail("nFanins == nCands",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsInter.c"
                    ,0x10e,"unsigned int *Abc_NtkMfsInterplateTruth(Mfs_Man_t *, int *, int, int)");
    }
  }
  else {
    p->nTimeOuts = p->nTimeOuts + 1;
    local_38 = (uint *)0x0;
  }
  return local_38;
}

Assistant:

unsigned * Abc_NtkMfsInterplateTruth( Mfs_Man_t * p, int * pCands, int nCands, int fInvert )
{
    sat_solver * pSat;
    Sto_Man_t * pCnf = NULL;
    unsigned * puTruth;
    int nFanins, status;
    int c, i, * pGloVars;

    // derive the SAT solver for interpolation
    pSat = Abc_MfsCreateSolverResub( p, pCands, nCands, fInvert );

    // solve the problem
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)p->pPars->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status != l_False )
    {
        p->nTimeOuts++;
        return NULL;
    }
    // get the learned clauses
    pCnf = (Sto_Man_t *)sat_solver_store_release( pSat );
    sat_solver_delete( pSat );

    // set the global variables
    pGloVars = Int_ManSetGlobalVars( p->pMan, nCands );
    for ( c = 0; c < nCands; c++ )
    {
        // get the variable number of this divisor
        i = lit_var( pCands[c] ) - 2 * p->pCnf->nVars;
        // get the corresponding SAT variable
        pGloVars[c] = Vec_IntEntry( p->vProjVarsCnf, i );
    }

    // derive the interpolant
    nFanins = Int_ManInterpolate( p->pMan, pCnf, 0, &puTruth );
    Sto_ManFree( pCnf );
    assert( nFanins == nCands );
    return puTruth;
}